

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

Node * prvTidyFindDocType(TidyDocImpl *doc)

{
  Node *pNVar1;
  
  if (doc == (TidyDocImpl *)0x0) {
    pNVar1 = (Node *)0x0;
  }
  else {
    pNVar1 = (doc->root).content;
  }
  for (; (pNVar1 != (Node *)0x0 && (pNVar1->type != DocTypeTag)); pNVar1 = pNVar1->next) {
  }
  return pNVar1;
}

Assistant:

Node *TY_(FindDocType)( TidyDocImpl* doc )
{
    Node* node;
    for ( node = (doc ? doc->root.content : NULL);
          node && node->type != DocTypeTag; 
          node = node->next )
        /**/;
    return node;
}